

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

ssize_t Curl_conn_send(Curl_easy *data,int num,void *mem,size_t len,CURLcode *code)

{
  Curl_cfilter *pCVar1;
  ssize_t sVar2;
  Curl_cfilter **ppCVar3;
  
  ppCVar3 = data->conn->cfilter + num;
  while( true ) {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (Curl_cfilter *)0x0) {
      Curl_failf(data,"send: no filter connected");
      *code = CURLE_FAILED_INIT;
      return -1;
    }
    if ((pCVar1->field_0x24 & 1) != 0) break;
    ppCVar3 = &pCVar1->next;
  }
  sVar2 = (*pCVar1->cft->do_send)(pCVar1,data,mem,len,code);
  return sVar2;
}

Assistant:

ssize_t Curl_conn_send(struct Curl_easy *data, int num,
                       const void *mem, size_t len, CURLcode *code)
{
  struct Curl_cfilter *cf;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  cf = data->conn->cfilter[num];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    return cf->cft->do_send(cf, data, mem, len, code);
  }
  failf(data, "send: no filter connected");
  DEBUGASSERT(0);
  *code = CURLE_FAILED_INIT;
  return -1;
}